

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

FunctionData * __thiscall
ExpressionContext::GetCurrentFunction(ExpressionContext *this,ScopeData *scopeData)

{
  long lVar1;
  FunctionData *function;
  ScopeData *curr;
  ScopeData *scopeData_local;
  ExpressionContext *this_local;
  
  function = (FunctionData *)scopeData;
  while( true ) {
    if (function == (FunctionData *)0x0) {
      return (FunctionData *)0x0;
    }
    lVar1._0_1_ = function->coroutine;
    lVar1._1_1_ = function->accessor;
    lVar1._2_1_ = function->isOperator;
    lVar1._3_5_ = *(undefined5 *)&function->field_0x23;
    if (lVar1 != 0) break;
    if ((FunctionData *)function->scope != (FunctionData *)0x0) {
      return (FunctionData *)function->scope;
    }
    function = (FunctionData *)function->source;
  }
  return (FunctionData *)0x0;
}

Assistant:

FunctionData* ExpressionContext::GetCurrentFunction(ScopeData *scopeData)
{
	// Walk up, but if we reach a type owner, stop - we're not in a context of a function
	for(ScopeData *curr = scopeData; curr; curr = curr->scope)
	{
		if(curr->ownerType)
			return NULL;

		if(FunctionData *function = curr->ownerFunction)
			return function;
	}

	return NULL;
}